

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O0

Pass * wasm::createDirectizePass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  anon_unknown_157::Directize::Directize((Directize *)this);
  return this;
}

Assistant:

Pass* createDirectizePass() { return new Directize(); }